

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O0

void __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::add
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *methods,string *pattern,unique_function<bool_(HttpRouter<RouterData>_*)> *handler,
          uint32_t priority)

{
  string_view url;
  bool bVar1;
  reference pbVar2;
  Node *this_00;
  string *in_RDX;
  HttpRouter<uWS::HttpContextData<true>::RouterData> *in_RDI;
  undefined4 in_R8D;
  int i;
  Node *node;
  string method;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  iterator in_stack_fffffffffffffe68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe88;
  allocator<char> *__a;
  Node *__t;
  iterator in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  allocator<char> local_101 [25];
  string local_e8 [15];
  undefined1 in_stack_ffffffffffffff27;
  string *in_stack_ffffffffffffff28;
  Node *in_stack_ffffffffffffff30;
  HttpRouter<uWS::HttpContextData<true>::RouterData> *in_stack_ffffffffffffff38;
  byte local_b8;
  string local_88 [32];
  Node *local_68;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38 [2];
  undefined4 local_24;
  
  local_24 = in_R8D;
  local_38[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffe58);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_38);
    std::__cxx11::string::string(local_60,(string *)pbVar2);
    std::__cxx11::string::string(local_88,local_60);
    this_00 = getNode(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (bool)in_stack_ffffffffffffff27);
    std::__cxx11::string::~string(local_88);
    local_68 = this_00;
    url = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
    setUrl(in_RDI,url);
    while( true ) {
      getUrlSegment((HttpRouter<uWS::HttpContextData<true>::RouterData> *)
                    in_stack_fffffffffffffee0._M_current,
                    (int)((ulong)in_stack_fffffffffffffed8._M_current >> 0x20));
      if (((local_b8 ^ 0xff) & 1) == 0) break;
      __t = local_68;
      getUrlSegment((HttpRouter<uWS::HttpContextData<true>::RouterData> *)
                    in_stack_fffffffffffffee0._M_current,
                    (int)((ulong)in_stack_fffffffffffffed8._M_current >> 0x20));
      __a = local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (&this_00->name,(basic_string_view<char,_std::char_traits<char>_> *)__t,__a);
      in_stack_fffffffffffffe88._M_current =
           (uint *)getNode(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27);
      local_68 = (Node *)in_stack_fffffffffffffe88._M_current;
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(local_101);
    }
    in_stack_fffffffffffffe70 = &local_68->handlers;
    in_stack_fffffffffffffee0 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe58
                   );
    in_stack_fffffffffffffed8 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe58
                   );
    uVar3 = local_24;
    std::
    vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
    ::size(&in_RDI->handlers);
    in_stack_fffffffffffffe80 =
         std::
         upper_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                   (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                    (uint *)CONCAT44(uVar3,in_stack_fffffffffffffe78));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe64 = local_24;
    std::
    vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
    ::size(&in_RDI->handlers);
    in_stack_fffffffffffffe68 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    in_stack_fffffffffffffe68._M_current,
                    (value_type_conflict2 *)in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_60);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_38);
  }
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
  ::
  emplace_back<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>
            ((vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
              *)in_stack_fffffffffffffe70,
             (function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
              *)in_stack_fffffffffffffe68._M_current);
  return;
}

Assistant:

void add(std::vector<std::string> methods, std::string pattern, fu2::unique_function<bool(HttpRouter *)> &&handler, uint32_t priority = MEDIUM_PRIORITY) {
        for (std::string method : methods) {
            /* Lookup method */
            Node *node = getNode(&root, method, false);
            /* Iterate over all segments */
            setUrl(pattern);
            for (int i = 0; !getUrlSegment(i).second; i++) {
                node = getNode(node, std::string(getUrlSegment(i).first), priority == HIGH_PRIORITY);
            }
            /* Insert handler in order sorted by priority (most significant 1 byte) */
            node->handlers.insert(std::upper_bound(node->handlers.begin(), node->handlers.end(), (uint32_t) (priority | handlers.size())), (uint32_t) (priority | handlers.size()));
        }

        /* Alloate this handler */
        handlers.emplace_back(std::move(handler));
    }